

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O2

parser_error parse_player_timed_brand(parser *p)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  parser_error pVar4;
  long *plVar5;
  char *__s1;
  uint uVar6;
  brand_conflict *pbVar7;
  ulong uVar8;
  
  plVar5 = (long *)parser_priv(p);
  __s1 = parser_getsym(p,"name");
  if (plVar5 == (long *)0x0) {
    __assert_fail("ps",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                  ,0x170,"enum parser_error parse_player_timed_brand(struct parser *)");
  }
  lVar2 = *plVar5;
  if (lVar2 == 0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pVar4 = PARSE_ERROR_UNRECOGNISED_BRAND;
    if (__s1 != (char *)0x0) {
      bVar1 = z_info->brand_max;
      uVar6 = (uint)bVar1 + (uint)(bVar1 == 0);
      pbVar7 = brands;
      for (uVar8 = 1; pbVar7 = pbVar7 + 1, uVar8 < bVar1; uVar8 = uVar8 + 1) {
        iVar3 = strcmp(__s1,pbVar7->code);
        if (iVar3 == 0) {
          uVar6 = (uint)uVar8;
          break;
        }
      }
      pVar4 = PARSE_ERROR_UNRECOGNISED_BRAND;
      if (uVar6 != bVar1) {
        *(uint *)(lVar2 + 0x6c) = uVar6;
        pVar4 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_player_timed_brand(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *name = parser_getsym(p, "name");
	int idx = z_info->brand_max;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (name) {
		for (idx = 1; idx < z_info->brand_max; ++idx) {
			if (streq(name, brands[idx].code)) break;
		}
	}
	if (idx == z_info->brand_max) {
		return PARSE_ERROR_UNRECOGNISED_BRAND;
	}
	ps->t->temp_brand = idx;
	return PARSE_ERROR_NONE;
}